

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_descent_parser.cpp
# Opt level: O2

JsonValue * __thiscall MercuryJson::JSON::_parse_array(JSON *this)

{
  char encountered;
  ulong uVar1;
  ulong *puVar2;
  JsonArray *args;
  JsonArray *pJVar3;
  JsonArray *pJVar4;
  JsonValue *pJVar5;
  runtime_error *this_00;
  
  uVar1 = *this->idx_ptr;
  if (this->input[uVar1] == ']') {
    this->idx_ptr = this->idx_ptr + 1;
    if (uVar1 < this->input_len) {
      args = (JsonArray *)0x0;
LAB_00112709:
      pJVar5 = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonValue,MercuryJson::JsonArray*>(&this->allocator,args);
      return pJVar5;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"text ended prematurely");
  }
  else {
    pJVar5 = _parse_value(this);
    args = BlockAllocator<MercuryJson::JsonValue>::
           construct<MercuryJson::JsonArray,MercuryJson::JsonValue*>(&this->allocator,pJVar5);
    pJVar3 = args;
    while( true ) {
      puVar2 = this->idx_ptr;
      this->idx_ptr = puVar2 + 1;
      uVar1 = *puVar2;
      if (this->input_len <= uVar1) break;
      encountered = this->input[uVar1];
      if (encountered != ',') {
        if (encountered != ']') {
          _error(this,"\',\'",encountered,uVar1);
        }
        goto LAB_00112709;
      }
      pJVar5 = _parse_value(this);
      pJVar4 = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonArray,MercuryJson::JsonValue*>(&this->allocator,pJVar5);
      pJVar3->next = pJVar4;
      pJVar3 = pJVar4;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"text ended prematurely");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JsonValue *JSON::_parse_array() {
        size_t idx;
        char ch;
        peek_char();
        if (ch == ']') {
            next_char();
            return allocator.construct(static_cast<JsonArray *>(nullptr));
        }
        JsonValue *value = _parse_value();
        auto *array = allocator.construct<JsonArray>(value), *ptr = array;
        while (true) {
            next_char();
            if (ch == ']') break;
            expect(',');
            value = _parse_value();
            ptr = ptr->next = allocator.construct<JsonArray>(value);
        }
        return allocator.construct(array);
    }